

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestCaseGroup *
vkt::api::anon_unknown_1::createGroup
          (TestContext *testCtx,char *name,char *desc,CaseDescriptions *cases)

{
  pointer pBVar1;
  pointer *ppVVar2;
  deUint32 dVar3;
  VkBufferUsageFlags VVar4;
  VkSemaphoreCreateFlags VVar5;
  VkEventCreateFlags VVar6;
  VkFenceCreateFlags VVar7;
  VkQueryPipelineStatisticFlags VVar8;
  VkCommandPoolCreateFlags VVar9;
  TestContext *pTVar10;
  TestContext *pTVar11;
  Parameters PVar12;
  pointer pcVar13;
  Parameters PVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  void *pvVar22;
  TestNode *this;
  TestNode *pTVar23;
  long lVar24;
  CaseDescriptions *pCVar25;
  NamedParameters<vkt::api::(anonymous_namespace)::ImageView> *pNVar26;
  Parameters *pPVar27;
  _Alloc_hider *p_Var28;
  string *psVar29;
  NamedParameters<vkt::api::(anonymous_namespace)::ShaderModule> *pNVar30;
  NamedParameters<vkt::api::(anonymous_namespace)::Instance> *pNVar31;
  NamedParameters<vkt::api::(anonymous_namespace)::Device> *pNVar32;
  NamedParameters<vkt::api::(anonymous_namespace)::DeviceMemory> *pNVar33;
  NamedParameters<vkt::api::(anonymous_namespace)::Buffer> *pNVar34;
  NamedParameters<vkt::api::(anonymous_namespace)::BufferView> *pNVar35;
  NamedParameters<vkt::api::(anonymous_namespace)::Image> *pNVar36;
  NamedParameters<vkt::api::(anonymous_namespace)::Semaphore> *pNVar37;
  NamedParameters<vkt::api::(anonymous_namespace)::Event> *pNVar38;
  NamedParameters<vkt::api::(anonymous_namespace)::Fence> *pNVar39;
  NamedParameters<vkt::api::(anonymous_namespace)::QueryPool> *pNVar40;
  NamedParameters<vkt::api::(anonymous_namespace)::Sampler> *pNVar41;
  NamedParameters<vkt::api::(anonymous_namespace)::PipelineCache> *pNVar42;
  NamedParameters<vkt::api::(anonymous_namespace)::RenderPass> *pNVar43;
  NamedParameters<vkt::api::(anonymous_namespace)::GraphicsPipeline> *pNVar44;
  NamedParameters<vkt::api::(anonymous_namespace)::ComputePipeline> *pNVar45;
  NamedParameters<vkt::api::(anonymous_namespace)::Framebuffer> *pNVar46;
  NamedParameters<vkt::api::(anonymous_namespace)::CommandPool> *pNVar47;
  NamedParameters<vkt::api::(anonymous_namespace)::CommandBuffer> *pNVar48;
  NamedParameters<vkt::api::(anonymous_namespace)::PipelineLayout> *pNVar49;
  NamedParameters<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *pNVar50;
  NamedParameters<vkt::api::(anonymous_namespace)::DescriptorPool> *pNVar51;
  NamedParameters<vkt::api::(anonymous_namespace)::DescriptorSet> *pNVar52;
  byte bVar53;
  allocator<char> local_171;
  undefined1 local_170 [8];
  undefined1 local_168 [9];
  undefined7 uStack_15f;
  VkDescriptorPoolSize local_158 [2];
  pointer local_148;
  CaseDescriptions *local_140;
  _Alloc_hider local_138;
  undefined1 auStack_130 [8];
  undefined1 local_128 [24];
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined1 local_e0 [8];
  undefined1 local_d8 [8];
  vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> local_d0;
  pointer local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [17];
  undefined7 uStack_77;
  undefined1 local_68 [8];
  pointer local_60;
  pointer local_58;
  pointer local_50 [2];
  pointer local_40;
  TestContext *local_38;
  
  bVar53 = 0;
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,name,desc);
  pNVar31 = (cases->instance).paramsBegin;
  if (pNVar31 != (cases->instance).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar31->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      pTVar10 = (TestContext *)(cases->instance).function;
      pTVar11 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51688;
      pTVar23[1].m_testCtx = pTVar10;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar31 = pNVar31 + 1;
    } while (pNVar31 != (cases->instance).paramsEnd);
  }
  pNVar32 = (cases->device).paramsBegin;
  local_140 = cases;
  if (pNVar32 != (cases->device).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar32->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      pTVar10 = (TestContext *)(cases->device).function;
      PVar12 = pNVar32->parameters;
      pTVar11 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51728;
      pTVar23[1].m_testCtx = pTVar10;
      pTVar23[1].m_name._M_dataplus._M_p = (pointer)PVar12;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      cases = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar32 = pNVar32 + 1;
    } while (pNVar32 != (cases->device).paramsEnd);
  }
  pNVar33 = (cases->deviceMemory).paramsBegin;
  if (pNVar33 != (cases->deviceMemory).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar33->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      local_38 = (TestContext *)(cases->deviceMemory).function;
      pcVar13 = (pointer)(pNVar33->parameters).size;
      dVar3 = (pNVar33->parameters).memoryTypeIndex;
      pTVar10 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x90);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar10,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d517c8;
      pTVar23[1].m_testCtx = local_38;
      pTVar23[1].m_name._M_dataplus._M_p = pcVar13;
      *(deUint32 *)&pTVar23[1].m_name._M_string_length = dVar3;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      cases = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar33 = pNVar33 + 1;
    } while (pNVar33 != (cases->deviceMemory).paramsEnd);
  }
  pNVar34 = (cases->buffer).paramsBegin;
  if (pNVar34 != (cases->buffer).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar34->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      local_38 = (TestContext *)(cases->buffer).function;
      pcVar13 = (pointer)(pNVar34->parameters).size;
      VVar4 = (pNVar34->parameters).usage;
      pTVar10 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x90);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar10,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51868;
      pTVar23[1].m_testCtx = local_38;
      pTVar23[1].m_name._M_dataplus._M_p = pcVar13;
      *(VkBufferUsageFlags *)&pTVar23[1].m_name._M_string_length = VVar4;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      cases = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar34 = pNVar34 + 1;
    } while (pNVar34 != (cases->buffer).paramsEnd);
  }
  pNVar35 = (cases->bufferView).paramsBegin;
  if (pNVar35 != (cases->bufferView).paramsEnd) {
    ppVVar2 = &local_d0.
               super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_170,pNVar35->name,(allocator<char> *)local_68);
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      pTVar10 = (TestContext *)(cases->bufferView).function;
      local_128._16_8_ = (pNVar35->parameters).range;
      local_138._M_p = (pointer)(pNVar35->parameters).buffer.size;
      auStack_130 = *(undefined1 (*) [8])&(pNVar35->parameters).buffer.usage;
      local_128._0_8_ = *(undefined8 *)&(pNVar35->parameters).format;
      local_128._8_8_ = (pNVar35->parameters).offset;
      pTVar11 = this->m_testCtx;
      local_d8 = (undefined1  [8])ppVVar2;
      pTVar23 = (TestNode *)operator_new(0xa8);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,(char *)local_170,
                 (char *)ppVVar2);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51908;
      pTVar23[1].m_testCtx = pTVar10;
      pTVar23[1].m_name._M_dataplus._M_p = local_138._M_p;
      pTVar23[1].m_name._M_string_length = (size_type)auStack_130;
      pTVar23[1].m_name.field_2._M_allocated_capacity = local_128._0_8_;
      *(undefined8 *)((long)&pTVar23[1].m_name.field_2 + 8) = local_128._8_8_;
      pTVar23[1].m_description._M_dataplus._M_p = (pointer)local_128._16_8_;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_d8 != (undefined1  [8])ppVVar2) {
        operator_delete((void *)local_d8,
                        CONCAT71(local_d0.
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 local_d0.
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
      }
      if (local_170 != (undefined1  [8])(local_168 + 8)) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pNVar35 = pNVar35 + 1;
    } while (pNVar35 != (cases->bufferView).paramsEnd);
  }
  pNVar36 = (cases->image).paramsBegin;
  if (pNVar36 != (cases->image).paramsEnd) {
    ppVVar2 = &local_d0.
               super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_170,pNVar36->name,(allocator<char> *)local_68);
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      pTVar10 = (TestContext *)(cases->image).function;
      local_138._M_p = *(pointer *)&pNVar36->parameters;
      auStack_130 = *(undefined1 (*) [8])&(pNVar36->parameters).format;
      local_128._0_8_ = *(undefined8 *)&(pNVar36->parameters).extent.height;
      local_128._8_8_ = *(undefined8 *)&(pNVar36->parameters).mipLevels;
      local_128._16_8_ = *(undefined8 *)&(pNVar36->parameters).samples;
      uVar15 = (pNVar36->parameters).usage;
      uVar16 = (pNVar36->parameters).initialLayout;
      pTVar11 = this->m_testCtx;
      uStack_110 = uVar15;
      uStack_10c = uVar16;
      local_d8 = (undefined1  [8])ppVVar2;
      pTVar23 = (TestNode *)operator_new(0xb0);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,(char *)local_170,
                 (char *)ppVVar2);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d519a8;
      pTVar23[1].m_testCtx = pTVar10;
      pTVar23[1].m_name._M_dataplus._M_p = local_138._M_p;
      pTVar23[1].m_name._M_string_length = (size_type)auStack_130;
      pTVar23[1].m_name.field_2._M_allocated_capacity = local_128._0_8_;
      *(undefined8 *)((long)&pTVar23[1].m_name.field_2 + 8) = local_128._8_8_;
      pTVar23[1].m_description._M_dataplus._M_p = (pointer)local_128._16_8_;
      pTVar23[1].m_description._M_string_length = CONCAT44(uStack_10c,uStack_110);
      tcu::TestNode::addChild(this,pTVar23);
      if (local_d8 != (undefined1  [8])ppVVar2) {
        operator_delete((void *)local_d8,
                        CONCAT71(local_d0.
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 local_d0.
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
      }
      if (local_170 != (undefined1  [8])(local_168 + 8)) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pNVar36 = pNVar36 + 1;
    } while (pNVar36 != (cases->image).paramsEnd);
  }
  pNVar26 = (cases->imageView).paramsBegin;
  if (pNVar26 != (cases->imageView).paramsEnd) {
    ppVVar2 = &local_d0.
               super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_170,pNVar26->name,(allocator<char> *)local_68);
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      pTVar10 = (TestContext *)(cases->imageView).function;
      pPVar27 = &pNVar26->parameters;
      p_Var28 = &local_138;
      local_d8 = (undefined1  [8])ppVVar2;
      for (lVar24 = 0xb; lVar24 != 0; lVar24 = lVar24 + -1) {
        p_Var28->_M_p = *(pointer *)&pPVar27->image;
        pPVar27 = (Parameters *)((long)pPVar27 + (ulong)bVar53 * -0x10 + 8);
        p_Var28 = p_Var28 + (ulong)bVar53 * -2 + 1;
      }
      local_e0._0_4_ = (pNVar26->parameters).subresourceRange.layerCount;
      pTVar11 = this->m_testCtx;
      pTVar23 = (TestNode *)operator_new(0xe0);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,(char *)local_170,
                 (char *)ppVVar2);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51a48;
      pTVar23[1].m_testCtx = pTVar10;
      p_Var28 = &local_138;
      psVar29 = &pTVar23[1].m_name;
      for (lVar24 = 0xb; lVar24 != 0; lVar24 = lVar24 + -1) {
        (psVar29->_M_dataplus)._M_p = p_Var28->_M_p;
        p_Var28 = p_Var28 + (ulong)bVar53 * -2 + 1;
        psVar29 = (string *)((long)psVar29 + (ulong)bVar53 * -0x10 + 8);
      }
      *(undefined4 *)
       &pTVar23[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = local_e0._0_4_;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_d8 != (undefined1  [8])ppVVar2) {
        operator_delete((void *)local_d8,
                        CONCAT71(local_d0.
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 local_d0.
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
      }
      if (local_170 != (undefined1  [8])(local_168 + 8)) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pNVar26 = pNVar26 + 1;
    } while (pNVar26 != (cases->imageView).paramsEnd);
  }
  pNVar37 = (cases->semaphore).paramsBegin;
  if (pNVar37 != (cases->semaphore).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar37->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      pTVar10 = (TestContext *)(cases->semaphore).function;
      VVar5 = (pNVar37->parameters).flags;
      pTVar11 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51ae8;
      pTVar23[1].m_testCtx = pTVar10;
      *(VkSemaphoreCreateFlags *)&pTVar23[1].m_name._M_dataplus._M_p = VVar5;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      cases = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar37 = pNVar37 + 1;
    } while (pNVar37 != (cases->semaphore).paramsEnd);
  }
  pNVar38 = (cases->event).paramsBegin;
  if (pNVar38 != (cases->event).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar38->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      pTVar10 = (TestContext *)(cases->event).function;
      VVar6 = (pNVar38->parameters).flags;
      pTVar11 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51b88;
      pTVar23[1].m_testCtx = pTVar10;
      *(VkEventCreateFlags *)&pTVar23[1].m_name._M_dataplus._M_p = VVar6;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      cases = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar38 = pNVar38 + 1;
    } while (pNVar38 != (cases->event).paramsEnd);
  }
  pNVar39 = (cases->fence).paramsBegin;
  if (pNVar39 != (cases->fence).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar39->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      pTVar10 = (TestContext *)(cases->fence).function;
      VVar7 = (pNVar39->parameters).flags;
      pTVar11 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51c28;
      pTVar23[1].m_testCtx = pTVar10;
      *(VkFenceCreateFlags *)&pTVar23[1].m_name._M_dataplus._M_p = VVar7;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      cases = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar39 = pNVar39 + 1;
    } while (pNVar39 != (cases->fence).paramsEnd);
  }
  pNVar40 = (cases->queryPool).paramsBegin;
  if (pNVar40 != (cases->queryPool).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar40->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      local_38 = (TestContext *)(cases->queryPool).function;
      pcVar13 = *(pointer *)&pNVar40->parameters;
      VVar8 = (pNVar40->parameters).pipelineStatistics;
      pTVar10 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x90);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar10,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51cc8;
      pTVar23[1].m_testCtx = local_38;
      pTVar23[1].m_name._M_dataplus._M_p = pcVar13;
      *(VkQueryPipelineStatisticFlags *)&pTVar23[1].m_name._M_string_length = VVar8;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      cases = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar40 = pNVar40 + 1;
    } while (pNVar40 != (cases->queryPool).paramsEnd);
  }
  pNVar41 = (cases->sampler).paramsBegin;
  if (pNVar41 != (cases->sampler).paramsEnd) {
    ppVVar2 = &local_d0.
               super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_170,pNVar41->name,(allocator<char> *)local_68);
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      pTVar10 = (TestContext *)(cases->sampler).function;
      local_138._M_p = *(pointer *)&pNVar41->parameters;
      auStack_130 = *(undefined1 (*) [8])&(pNVar41->parameters).mipmapMode;
      local_128._0_8_ = *(undefined8 *)&(pNVar41->parameters).addressModeV;
      local_128._8_8_ = *(undefined8 *)&(pNVar41->parameters).mipLodBias;
      local_128._16_8_ = *(undefined8 *)&(pNVar41->parameters).maxAnisotropy;
      uVar17 = (pNVar41->parameters).compareOp;
      uVar18 = (pNVar41->parameters).minLod;
      uVar19 = (pNVar41->parameters).maxLod;
      uVar20 = (pNVar41->parameters).borderColor;
      uVar21 = (pNVar41->parameters).unnormalizedCoordinates;
      pTVar11 = this->m_testCtx;
      uStack_110 = uVar17;
      uStack_10c = uVar18;
      local_108 = uVar19;
      uStack_104 = uVar20;
      uStack_100 = uVar21;
      local_d8 = (undefined1  [8])ppVVar2;
      pTVar23 = (TestNode *)operator_new(0xc0);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,(char *)local_170,
                 (char *)ppVVar2);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51d68;
      pTVar23[1].m_testCtx = pTVar10;
      pTVar23[1].m_name._M_dataplus._M_p = local_138._M_p;
      pTVar23[1].m_name._M_string_length = (size_type)auStack_130;
      pTVar23[1].m_name.field_2._M_allocated_capacity = local_128._0_8_;
      *(undefined8 *)((long)&pTVar23[1].m_name.field_2 + 8) = local_128._8_8_;
      pTVar23[1].m_description._M_dataplus._M_p = (pointer)local_128._16_8_;
      pTVar23[1].m_description._M_string_length = CONCAT44(uStack_10c,uStack_110);
      *(ulong *)((long)&pTVar23[1].m_description._M_string_length + 4) =
           CONCAT44(local_108,uStack_10c);
      *(ulong *)((long)&pTVar23[1].m_description.field_2 + 4) = CONCAT44(uStack_100,uStack_104);
      tcu::TestNode::addChild(this,pTVar23);
      if (local_d8 != (undefined1  [8])ppVVar2) {
        operator_delete((void *)local_d8,
                        CONCAT71(local_d0.
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 local_d0.
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
      }
      cases = local_140;
      if (local_170 != (undefined1  [8])(local_168 + 8)) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pNVar41 = pNVar41 + 1;
    } while (pNVar41 != (cases->sampler).paramsEnd);
  }
  pNVar30 = (cases->shaderModule).paramsBegin;
  if (pNVar30 != (cases->shaderModule).paramsEnd) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,pNVar30->name,&local_171);
      local_a8._0_8_ = local_98;
      local_a8._8_8_ = (pointer)0x0;
      local_98[0] = '\0';
      pTVar10 = (TestContext *)(local_140->shaderModule).function;
      local_68._0_4_ = (pNVar30->parameters).shaderStage;
      local_60 = (pointer)local_50;
      pcVar13 = (pNVar30->parameters).binaryName._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar13,
                 pcVar13 + (pNVar30->parameters).binaryName._M_string_length);
      pTVar11 = this->m_testCtx;
      local_d8._0_4_ = local_68._0_4_;
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_d0.
                     super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_60,
                 (long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                           *)&local_60->binding)->
                        super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                        )._M_impl.super__Vector_impl_data._M_start +
                 (long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                           *)&local_58->binding)->
                        super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                        )._M_impl.super__Vector_impl_data._M_start);
      pTVar23 = (TestNode *)operator_new(0xa8);
      local_170._0_4_ = local_d8._0_4_;
      local_168._0_8_ = local_158;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_168,
                 local_d0.
                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (long)&(local_d0.
                         super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                         ._M_impl.super__Vector_impl_data._M_start)->type +
                 CONCAT71(local_d0.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                          local_d0.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_1_));
      auStack_130._0_4_ = local_170._0_4_;
      local_128._0_8_ = local_128 + 0x10;
      local_138._M_p = (pointer)pTVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_128,local_168._0_8_,
                 (long)(VkDescriptorType *)local_168._0_8_ + CONCAT71(uStack_15f,local_168[8]));
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,(char *)local_88._0_8_,
                 (char *)local_a8._0_8_);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00d51e08;
      pTVar23[1]._vptr_TestNode = (_func_int **)ShaderModule::initPrograms;
      pTVar23[1].m_testCtx = (TestContext *)local_138._M_p;
      *(undefined4 *)&pTVar23[1].m_name._M_dataplus._M_p = auStack_130._0_4_;
      pTVar23[1].m_name._M_string_length = (size_type)((long)&pTVar23[1].m_name.field_2 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar23[1].m_name._M_string_length,local_128._0_8_,
                 (undefined1 *)
                 ((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                            *)local_128._0_8_)->
                         super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                         )._M_impl.super__Vector_impl_data._M_start +
                 (long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                           *)local_128._8_8_)->
                        super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                        )._M_impl.super__Vector_impl_data._M_start));
      if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_,(ulong)((long)(qpTestLog **)local_128._16_8_ + 1));
      }
      if ((VkDescriptorPoolSize *)local_168._0_8_ != local_158) {
        operator_delete((void *)local_168._0_8_,(long)local_158[0] + 1);
      }
      tcu::TestNode::addChild(this,pTVar23);
      if (local_d0.
          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_d0.
                    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_d0.
                        super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&(local_d0.
                                        super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->type +
                               1));
      }
      if (local_60 != (pointer)local_50) {
        operator_delete(local_60,(ulong)((long)&local_50[0]->stageFlags + 1));
      }
      if ((pointer)local_a8._0_8_ != (pointer)local_98) {
        operator_delete((void *)local_a8._0_8_,CONCAT71(local_98._1_7_,local_98[0]) + 1);
      }
      if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,CONCAT71(uStack_77,local_88[0x10]) + 1);
      }
      pNVar30 = pNVar30 + 1;
    } while (pNVar30 != (local_140->shaderModule).paramsEnd);
  }
  pNVar42 = (local_140->pipelineCache).paramsBegin;
  pCVar25 = local_140;
  if (pNVar42 != (local_140->pipelineCache).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar42->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      pTVar10 = (TestContext *)(pCVar25->pipelineCache).function;
      pTVar11 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51ea8;
      pTVar23[1].m_testCtx = pTVar10;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pCVar25 = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar42 = pNVar42 + 1;
    } while (pNVar42 != (pCVar25->pipelineCache).paramsEnd);
  }
  pNVar49 = (pCVar25->pipelineLayout).paramsBegin;
  if (pNVar49 != (pCVar25->pipelineLayout).paramsEnd) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,pNVar49->name,&local_171);
      local_a8._0_8_ = local_98;
      local_a8._8_8_ = (pointer)0x0;
      local_98[0] = '\0';
      pTVar10 = (TestContext *)(local_140->pipelineLayout).function;
      PipelineLayout::Parameters::Parameters((Parameters *)local_68,&pNVar49->parameters);
      pTVar11 = this->m_testCtx;
      PipelineLayout::Parameters::Parameters((Parameters *)local_d8,(Parameters *)local_68);
      pTVar23 = (TestNode *)operator_new(0xb0);
      PipelineLayout::Parameters::Parameters((Parameters *)local_170,(Parameters *)local_d8);
      local_138._M_p = (pointer)pTVar10;
      PipelineLayout::Parameters::Parameters((Parameters *)auStack_130,(Parameters *)local_170);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,(char *)local_88._0_8_,
                 (char *)local_a8._0_8_);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00d51f48;
      pTVar23[1].m_testCtx = (TestContext *)local_138._M_p;
      PipelineLayout::Parameters::Parameters
                ((Parameters *)&pTVar23[1].m_name,(Parameters *)auStack_130);
      if ((pointer)local_128._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_128._16_8_,CONCAT44(uStack_104,local_108) - local_128._16_8_);
      }
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
      ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                 *)auStack_130);
      if (local_158[0] != (VkDescriptorPoolSize)0x0) {
        operator_delete((void *)local_158[0],(long)local_148 - (long)local_158[0]);
      }
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
      ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                 *)local_170);
      tcu::TestNode::addChild(this,pTVar23);
      if ((pointer)local_d0.
                   super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(local_d0.
                        super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (long)local_b0 -
                        (long)local_d0.
                              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
      ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                 *)local_d8);
      if (local_50[0] != (pointer)0x0) {
        operator_delete(local_50[0],(long)local_40 - (long)local_50[0]);
      }
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
      ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                 *)local_68);
      if ((pointer)local_a8._0_8_ != (pointer)local_98) {
        operator_delete((void *)local_a8._0_8_,CONCAT71(local_98._1_7_,local_98[0]) + 1);
      }
      if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,CONCAT71(uStack_77,local_88[0x10]) + 1);
      }
      pNVar49 = pNVar49 + 1;
    } while (pNVar49 != (local_140->pipelineLayout).paramsEnd);
  }
  pNVar43 = (local_140->renderPass).paramsBegin;
  pCVar25 = local_140;
  if (pNVar43 != (local_140->renderPass).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar43->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      pTVar10 = (TestContext *)(pCVar25->renderPass).function;
      pTVar11 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51fe8;
      pTVar23[1].m_testCtx = pTVar10;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pCVar25 = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar43 = pNVar43 + 1;
    } while (pNVar43 != (pCVar25->renderPass).paramsEnd);
  }
  pNVar44 = (pCVar25->graphicsPipeline).paramsBegin;
  if (pNVar44 != (pCVar25->graphicsPipeline).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar44->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      pTVar10 = (TestContext *)(pCVar25->graphicsPipeline).function;
      pTVar11 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d52088;
      pTVar23[1]._vptr_TestNode = (_func_int **)GraphicsPipeline::initPrograms;
      pTVar23[1].m_testCtx = pTVar10;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pCVar25 = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar44 = pNVar44 + 1;
    } while (pNVar44 != (pCVar25->graphicsPipeline).paramsEnd);
  }
  pNVar45 = (pCVar25->computePipeline).paramsBegin;
  if (pNVar45 != (pCVar25->computePipeline).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar45->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      pTVar10 = (TestContext *)(pCVar25->computePipeline).function;
      pTVar11 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d52128;
      pTVar23[1]._vptr_TestNode = (_func_int **)ComputePipeline::initPrograms;
      pTVar23[1].m_testCtx = pTVar10;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pCVar25 = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar45 = pNVar45 + 1;
    } while (pNVar45 != (pCVar25->computePipeline).paramsEnd);
  }
  pNVar50 = (pCVar25->descriptorSetLayout).paramsBegin;
  if (pNVar50 != (pCVar25->descriptorSetLayout).paramsEnd) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_170,pNVar50->name,&local_171);
      local_d8 = (undefined1  [8])
                 &local_d0.
                  super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      pTVar10 = (TestContext *)(local_140->descriptorSetLayout).function;
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_a8,&(pNVar50->parameters).bindings);
      pTVar11 = this->m_testCtx;
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_88,
               (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_a8);
      pTVar23 = (TestNode *)operator_new(0x98);
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_68,
               (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_88);
      local_138._M_p = (pointer)pTVar10;
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)auStack_130,
               (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_68);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,(char *)local_170,
                 (char *)local_d8);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00d521c8;
      pTVar23[1].m_testCtx = (TestContext *)local_138._M_p;
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)&pTVar23[1].m_name,
               (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)auStack_130);
      if (auStack_130 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_130,local_128._8_8_ - (long)auStack_130);
      }
      pvVar22 = (void *)CONCAT44(local_68._4_4_,local_68._0_4_);
      if (pvVar22 != (void *)0x0) {
        operator_delete(pvVar22,(long)local_58 - (long)pvVar22);
      }
      tcu::TestNode::addChild(this,pTVar23);
      if ((pointer)local_88._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_88._0_8_,CONCAT71(uStack_77,local_88[0x10]) - local_88._0_8_);
      }
      if ((pointer)local_a8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_a8._0_8_,CONCAT71(local_98._1_7_,local_98[0]) - local_a8._0_8_
                       );
      }
      if (local_d8 !=
          (undefined1  [8])
          &local_d0.
           super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)local_d8,
                        CONCAT71(local_d0.
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 local_d0.
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
      }
      if (local_170 != (undefined1  [8])(local_168 + 8)) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pNVar50 = pNVar50 + 1;
    } while (pNVar50 != (local_140->descriptorSetLayout).paramsEnd);
  }
  pNVar51 = (local_140->descriptorPool).paramsBegin;
  if (pNVar51 != (local_140->descriptorPool).paramsEnd) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68,pNVar51->name,&local_171);
      local_88._0_8_ = local_88 + 0x10;
      local_88._8_8_ = (pointer)0x0;
      local_88[0x10] = 0;
      pTVar10 = (TestContext *)(local_140->descriptorPool).function;
      local_a8._0_8_ = *(undefined8 *)&pNVar51->parameters;
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
                ((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 (local_a8 + 8),&(pNVar51->parameters).poolSizes);
      pTVar11 = this->m_testCtx;
      local_d8 = (undefined1  [8])local_a8._0_8_;
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
                (&local_d0,
                 (vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 (local_a8 + 8));
      pTVar23 = (TestNode *)operator_new(0xa0);
      local_170 = local_d8;
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
                ((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 local_168,&local_d0);
      auStack_130 = local_170;
      local_138._M_p = (pointer)pTVar10;
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
                ((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 local_128,
                 (vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 local_168);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,
                 (char *)CONCAT44(local_68._4_4_,local_68._0_4_),(char *)local_88._0_8_);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00d52268;
      pTVar23[1].m_testCtx = (TestContext *)local_138._M_p;
      pTVar23[1].m_name._M_dataplus._M_p = (pointer)auStack_130;
      std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
                ((vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 &pTVar23[1].m_name._M_string_length,
                 (vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *)
                 local_128);
      if ((pointer)local_128._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
      }
      if ((VkDescriptorPoolSize *)local_168._0_8_ != (VkDescriptorPoolSize *)0x0) {
        operator_delete((void *)local_168._0_8_,(long)local_158[0] - local_168._0_8_);
      }
      tcu::TestNode::addChild(this,pTVar23);
      if (local_d0.
          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.
                        super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_d0.
                              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.
                              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_a8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
      }
      if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,CONCAT71(uStack_77,local_88[0x10]) + 1);
      }
      if ((pointer *)CONCAT44(local_68._4_4_,local_68._0_4_) != &local_58) {
        operator_delete((pointer *)CONCAT44(local_68._4_4_,local_68._0_4_),
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)&local_58->binding)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar51 = pNVar51 + 1;
    } while (pNVar51 != (local_140->descriptorPool).paramsEnd);
  }
  pNVar52 = (local_140->descriptorSet).paramsBegin;
  if (pNVar52 != (local_140->descriptorSet).paramsEnd) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_170,pNVar52->name,&local_171);
      local_d8 = (undefined1  [8])
                 &local_d0.
                  super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      pTVar10 = (TestContext *)(local_140->descriptorSet).function;
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_a8,
               (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)&pNVar52->parameters);
      pTVar11 = this->m_testCtx;
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_88,
               (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_a8);
      pTVar23 = (TestNode *)operator_new(0x98);
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_68,
               (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_88);
      local_138._M_p = (pointer)pTVar10;
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)auStack_130,
               (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)local_68);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,(char *)local_170,
                 (char *)local_d8);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00d52308;
      pTVar23[1].m_testCtx = (TestContext *)local_138._M_p;
      std::
      vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)&pTVar23[1].m_name,
               (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                *)auStack_130);
      if (auStack_130 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_130,local_128._8_8_ - (long)auStack_130);
      }
      pvVar22 = (void *)CONCAT44(local_68._4_4_,local_68._0_4_);
      if (pvVar22 != (void *)0x0) {
        operator_delete(pvVar22,(long)local_58 - (long)pvVar22);
      }
      tcu::TestNode::addChild(this,pTVar23);
      if ((pointer)local_88._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_88._0_8_,CONCAT71(uStack_77,local_88[0x10]) - local_88._0_8_);
      }
      if ((pointer)local_a8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_a8._0_8_,CONCAT71(local_98._1_7_,local_98[0]) - local_a8._0_8_
                       );
      }
      if (local_d8 !=
          (undefined1  [8])
          &local_d0.
           super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)local_d8,
                        CONCAT71(local_d0.
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 local_d0.
                                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
      }
      if (local_170 != (undefined1  [8])(local_168 + 8)) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pNVar52 = pNVar52 + 1;
    } while (pNVar52 != (local_140->descriptorSet).paramsEnd);
  }
  pNVar46 = (local_140->framebuffer).paramsBegin;
  pCVar25 = local_140;
  if (pNVar46 != (local_140->framebuffer).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar46->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      pTVar10 = (TestContext *)(pCVar25->framebuffer).function;
      pTVar11 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d523a8;
      pTVar23[1].m_testCtx = pTVar10;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pCVar25 = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar46 = pNVar46 + 1;
    } while (pNVar46 != (pCVar25->framebuffer).paramsEnd);
  }
  pNVar47 = (pCVar25->commandPool).paramsBegin;
  if (pNVar47 != (pCVar25->commandPool).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar47->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      pTVar10 = (TestContext *)(pCVar25->commandPool).function;
      VVar9 = (pNVar47->parameters).flags;
      pTVar11 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d52448;
      pTVar23[1].m_testCtx = pTVar10;
      *(VkCommandPoolCreateFlags *)&pTVar23[1].m_name._M_dataplus._M_p = VVar9;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pCVar25 = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar47 = pNVar47 + 1;
    } while (pNVar47 != (pCVar25->commandPool).paramsEnd);
  }
  pNVar48 = (pCVar25->commandBuffer).paramsBegin;
  if (pNVar48 != (pCVar25->commandBuffer).paramsEnd) {
    pBVar1 = (pointer)(local_168 + 8);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pNVar48->name,(allocator<char> *)local_d8);
      local_168._0_8_ = (VkDescriptorPoolSize *)0x0;
      local_168[8] = 0;
      pTVar10 = (TestContext *)(pCVar25->commandBuffer).function;
      PVar14 = pNVar48->parameters;
      pTVar11 = this->m_testCtx;
      local_170 = (undefined1  [8])pBVar1;
      pTVar23 = (TestNode *)operator_new(0x88);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar23,pTVar11,NODETYPE_SELF_VALIDATE,local_138._M_p,(char *)pBVar1);
      pTVar23->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d524e8;
      pTVar23[1].m_testCtx = pTVar10;
      pTVar23[1].m_name._M_dataplus._M_p = (pointer)PVar14;
      tcu::TestNode::addChild(this,pTVar23);
      if (local_170 != (undefined1  [8])pBVar1) {
        operator_delete((void *)local_170,CONCAT71(uStack_15f,local_168[8]) + 1);
      }
      pCVar25 = local_140;
      if ((TestContext *)local_138._M_p != (TestContext *)local_128) {
        operator_delete(local_138._M_p,
                        (ulong)((long)&(((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                          *)local_128._0_8_)->
                                       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      pNVar48 = pNVar48 + 1;
    } while (pNVar48 != (pCVar25->commandBuffer).paramsEnd);
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createGroup (tcu::TestContext& testCtx, const char* name, const char* desc, const CaseDescriptions& cases)
{
	MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(testCtx, name, desc));

	addCases			(group, cases.instance);
	addCases			(group, cases.device);
	addCases			(group, cases.deviceMemory);
	addCases			(group, cases.buffer);
	addCases			(group, cases.bufferView);
	addCases			(group, cases.image);
	addCases			(group, cases.imageView);
	addCases			(group, cases.semaphore);
	addCases			(group, cases.event);
	addCases			(group, cases.fence);
	addCases			(group, cases.queryPool);
	addCases			(group, cases.sampler);
	addCasesWithProgs	(group, cases.shaderModule);
	addCases			(group, cases.pipelineCache);
	addCases			(group, cases.pipelineLayout);
	addCases			(group, cases.renderPass);
	addCasesWithProgs	(group, cases.graphicsPipeline);
	addCasesWithProgs	(group, cases.computePipeline);
	addCases			(group, cases.descriptorSetLayout);
	addCases			(group, cases.descriptorPool);
	addCases			(group, cases.descriptorSet);
	addCases			(group, cases.framebuffer);
	addCases			(group, cases.commandPool);
	addCases			(group, cases.commandBuffer);

	return group.release();
}